

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

tnt_error tnt_io_connect(tnt_stream_net *s)

{
  socklen_t __len;
  uri *puVar1;
  size_t sVar2;
  sockaddr *__addr;
  undefined8 uVar3;
  addrinfo *__ai;
  int iVar4;
  tnt_error tVar5;
  tnt_error tVar6;
  int *piVar7;
  int __timeout;
  char *__service;
  addrinfo *paVar8;
  char local_148 [8];
  char host [128];
  timeval start_connect;
  int local_58;
  int local_48;
  addrinfo *addr_info;
  pollfd local_38;
  pollfd fds [1];
  
  puVar1 = (s->opt).uri;
  if ((uint)puVar1->host_hint < 3) {
    __service = "3301";
    if (puVar1->service != (char *)0x0) {
      __service = puVar1->service;
    }
    sVar2 = puVar1->host_len;
    memcpy(local_148,puVar1->host,sVar2);
    _local_48 = (addrinfo *)0x0;
    local_148[sVar2] = '\0';
    host[0x78] = '\0';
    host[0x79] = '\0';
    host[0x7a] = '\0';
    host[0x7b] = '\0';
    host[0x7c] = '\0';
    host[0x7d] = '\0';
    host[0x7e] = '\0';
    host[0x7f] = '\0';
    iVar4 = getaddrinfo(local_148,__service,(addrinfo *)(host + 0x78),
                        (addrinfo **)&stack0xffffffffffffffb8);
    __ai = _local_48;
    if (_local_48 == (addrinfo *)0x0 || iVar4 != 0) {
      tVar6 = TNT_ERESOLVE;
    }
    else {
      tVar6 = TNT_EOK;
      for (paVar8 = _local_48; paVar8 != (addrinfo *)0x0; paVar8 = paVar8->ai_next) {
        iVar4 = socket(paVar8->ai_family,paVar8->ai_socktype,paVar8->ai_protocol);
        s->fd = iVar4;
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          s->errno_ = *piVar7;
          tVar6 = TNT_ESYSTEM;
        }
        else {
          tVar5 = tnt_io_setopts(s);
          if (tVar5 == TNT_EOK) {
            __addr = paVar8->ai_addr;
            __len = paVar8->ai_addrlen;
            tVar5 = tnt_io_nonblock(s,1);
            if (tVar5 == TNT_EOK) {
              iVar4 = connect(s->fd,__addr,__len);
              if (iVar4 != -1) {
                tVar6 = TNT_EOK;
                break;
              }
              piVar7 = __errno_location();
              iVar4 = *piVar7;
              if (iVar4 == 0x73) {
                iVar4 = gettimeofday((timeval *)(host + 0x78),(__timezone_ptr_t)0x0);
                if (iVar4 != -1) {
                  __timeout = (int)((s->opt).tmout_connect.tv_usec / 1000) +
                              (int)(s->opt).tmout_connect.tv_sec * 1000;
                  uVar3 = CONCAT62(host._122_6_,host._120_2_);
                  do {
                    local_38.fd = s->fd;
                    local_38.events = 4;
                    iVar4 = poll(&local_38,1,__timeout);
                    if (iVar4 != -1) {
                      if (iVar4 != 0) {
                        _local_48 = (addrinfo *)((ulong)_local_48 & 0xffffffff00000000);
                        local_38.fd = 4;
                        iVar4 = getsockopt(s->fd,1,4,&stack0xffffffffffffffb8,(socklen_t *)&local_38
                                          );
                        if (local_48 == 0 && iVar4 != -1) {
                          tVar6 = TNT_EOK;
                          tVar5 = tnt_io_nonblock(s,0);
                          if (tVar5 != TNT_EOK) goto LAB_0010a690;
                          goto LAB_0010a7ef;
                        }
                        iVar4 = local_48;
                        if (local_48 == 0) {
                          iVar4 = *piVar7;
                        }
                        s->errno_ = iVar4;
                        goto LAB_0010a68d;
                      }
                      break;
                    }
                    iVar4 = *piVar7;
                    if ((iVar4 != 0xb) && (iVar4 != 4)) goto LAB_0010a683;
                    iVar4 = gettimeofday((timeval *)&stack0xffffffffffffffb8,(__timezone_ptr_t)0x0);
                    if (iVar4 == -1) goto LAB_0010a67f;
                    local_58 = (int)uVar3;
                  } while ((int)((long)((long)&addr_info[-0x20000001].ai_next + 7) / 1000) +
                           (local_48 - local_58) * 1000 < __timeout);
                  tVar5 = TNT_ETMOUT;
                  goto LAB_0010a690;
                }
LAB_0010a67f:
                iVar4 = *piVar7;
              }
LAB_0010a683:
              s->errno_ = iVar4;
LAB_0010a68d:
              tVar5 = TNT_ESYSTEM;
            }
          }
LAB_0010a690:
          tVar6 = tVar5;
          tnt_io_close(s);
        }
      }
LAB_0010a7ef:
      freeaddrinfo(__ai);
    }
  }
  else {
    if (puVar1->host_hint != 3) {
      return TNT_EFAIL;
    }
    sVar2 = puVar1->service_len;
    memcpy(local_148,puVar1->service,sVar2);
    local_148[sVar2] = '\0';
    iVar4 = socket(1,1,0);
    s->fd = iVar4;
    if (iVar4 < 0) {
      piVar7 = __errno_location();
      s->errno_ = *piVar7;
      tVar6 = TNT_ESYSTEM;
    }
    else {
      tVar6 = tnt_io_setopts(s);
      if (tVar6 == TNT_EOK) {
        host[0x7a] = '\0';
        host[0x7b] = '\0';
        host[0x7c] = '\0';
        host[0x7d] = '\0';
        host[0x7e] = '\0';
        host[0x7f] = '\0';
        host[0x78] = '\x01';
        host[0x79] = '\0';
        strcpy(host + 0x7a,local_148);
        iVar4 = connect(s->fd,(sockaddr *)(host + 0x78),0x6e);
        tVar6 = TNT_EOK;
        if (iVar4 != -1) goto LAB_0010a7f8;
        tVar6 = TNT_ESYSTEM;
        piVar7 = __errno_location();
        s->errno_ = *piVar7;
      }
      tnt_io_close(s);
    }
  }
LAB_0010a7f8:
  if (tVar6 == TNT_EOK) {
    s->connected = 1;
    tVar6 = TNT_EOK;
  }
  return tVar6;
}

Assistant:

enum tnt_error
tnt_io_connect(struct tnt_stream_net *s)
{
	enum tnt_error result;
	struct uri *uri = s->opt.uri;
	switch (uri->host_hint) {
	case URI_NAME:
	case URI_IPV4:
	case URI_IPV6: {
		char host[128];
		const char *port = uri->service == NULL ? "3301" :
			uri->service;
		memcpy(host, uri->host, uri->host_len);
		host[uri->host_len] = '\0';
		result = tnt_io_connect_tcp(s, host, port);
		break;
	}
	case URI_UNIX: {
		char service[128];
		memcpy(service, uri->service, uri->service_len);
		service[uri->service_len] = '\0';
		result = tnt_io_connect_unix(s, service);
		break;
	}
	default:
		result = TNT_EFAIL;
	}
	if (result != TNT_EOK)
		return result;
	s->connected = 1;
	return TNT_EOK;
}